

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O0

void bufSizeTest(void)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  long lVar5;
  int maxh;
  unsigned_long dstSize;
  tjhandle handle;
  uchar *dstBuf;
  uchar *srcBuf;
  int subsamp;
  int i;
  int h;
  int w;
  ulong local_38;
  long local_30;
  long local_28;
  void *local_20;
  int local_18;
  int local_14;
  uint local_10;
  uint local_c;
  
  local_20 = (void *)0x0;
  local_28 = 0;
  local_30 = 0;
  local_38 = 0;
  local_30 = tjInitCompress();
  if (local_30 == 0) {
    uVar4 = tjGetErrorStr();
    printf("TurboJPEG ERROR:\n%s\n",uVar4);
    exitStatus = -1;
  }
  else {
    printf("Buffer size regression test\n");
    for (local_18 = 0; local_18 < 6; local_18 = local_18 + 1) {
      for (local_c = 1; (int)local_c < 0x30; local_c = local_c + 1) {
        iVar1 = 0x30;
        if (local_c == 1) {
          iVar1 = 0x800;
        }
        for (local_10 = 1; (int)local_10 < iVar1; local_10 = local_10 + 1) {
          if ((int)local_10 % 100 == 0) {
            printf("%.4d x %.4d\b\b\b\b\b\b\b\b\b\b\b",(ulong)local_c,(ulong)local_10);
          }
          local_20 = malloc((long)(int)(local_c * local_10 * 4));
          if (local_20 == (void *)0x0) {
            printf("ERROR: %s\n","Memory allocation failure");
            exitStatus = -1;
            goto LAB_00103510;
          }
          if ((alloc == 0) || (doYUV != 0)) {
            if (doYUV == 0) {
              local_38 = tjBufSize(local_c,local_10,local_18);
            }
            else {
              local_38 = tjBufSizeYUV2(local_c,pad,local_10,local_18);
            }
            local_28 = tjAlloc(local_38 & 0xffffffff);
            if (local_28 == 0) {
              printf("ERROR: %s\n","Memory allocation failure");
              exitStatus = -1;
              goto LAB_00103510;
            }
          }
          for (local_14 = 0; local_14 < (int)(local_c * local_10 * 4); local_14 = local_14 + 1) {
            lVar5 = random();
            if (lVar5 < 0x3fffffff) {
              *(undefined1 *)((long)local_20 + (long)local_14) = 0;
            }
            else {
              *(undefined1 *)((long)local_20 + (long)local_14) = 0xff;
            }
          }
          if (doYUV == 0) {
            uVar3 = 0x400;
            if (alloc != 0) {
              uVar3 = 0;
            }
            iVar2 = tjCompress2(local_30,local_20,local_c,0,local_10,3,&local_28,&local_38,local_18,
                                100,uVar3);
            if (iVar2 == -1) {
              uVar4 = tjGetErrorStr();
              printf("TurboJPEG ERROR:\n%s\n",uVar4);
              exitStatus = -1;
              goto LAB_00103510;
            }
          }
          else {
            iVar2 = tjEncodeYUV3(local_30,local_20,local_c,0,local_10,3,local_28,pad,local_18,0);
            if (iVar2 == -1) {
              uVar4 = tjGetErrorStr();
              printf("TurboJPEG ERROR:\n%s\n",uVar4);
              exitStatus = -1;
              goto LAB_00103510;
            }
          }
          free(local_20);
          local_20 = (void *)0x0;
          if ((alloc == 0) || (doYUV != 0)) {
            tjFree(local_28);
            local_28 = 0;
          }
          local_20 = malloc((long)(int)(local_10 * local_c * 4));
          if (local_20 == (void *)0x0) {
            printf("ERROR: %s\n","Memory allocation failure");
            exitStatus = -1;
            goto LAB_00103510;
          }
          if ((alloc == 0) || (doYUV != 0)) {
            if (doYUV == 0) {
              local_38 = tjBufSize(local_10,local_c,local_18);
            }
            else {
              local_38 = tjBufSizeYUV2(local_10,pad,local_c,local_18);
            }
            local_28 = tjAlloc(local_38 & 0xffffffff);
            if (local_28 == 0) {
              printf("ERROR: %s\n","Memory allocation failure");
              exitStatus = -1;
              goto LAB_00103510;
            }
          }
          for (local_14 = 0; local_14 < (int)(local_10 * local_c * 4); local_14 = local_14 + 1) {
            lVar5 = random();
            if (lVar5 < 0x3fffffff) {
              *(undefined1 *)((long)local_20 + (long)local_14) = 0;
            }
            else {
              *(undefined1 *)((long)local_20 + (long)local_14) = 0xff;
            }
          }
          if (doYUV == 0) {
            uVar3 = 0x400;
            if (alloc != 0) {
              uVar3 = 0;
            }
            iVar2 = tjCompress2(local_30,local_20,local_10,0,local_c,3,&local_28,&local_38,local_18,
                                100,uVar3);
            if (iVar2 == -1) {
              uVar4 = tjGetErrorStr();
              printf("TurboJPEG ERROR:\n%s\n",uVar4);
              exitStatus = -1;
              goto LAB_00103510;
            }
          }
          else {
            iVar2 = tjEncodeYUV3(local_30,local_20,local_10,0,local_c,3,local_28,pad,local_18,0);
            if (iVar2 == -1) {
              uVar4 = tjGetErrorStr();
              printf("TurboJPEG ERROR:\n%s\n",uVar4);
              exitStatus = -1;
              goto LAB_00103510;
            }
          }
          free(local_20);
          local_20 = (void *)0x0;
          if ((alloc == 0) || (doYUV != 0)) {
            tjFree(local_28);
            local_28 = 0;
          }
        }
      }
    }
    printf("Done.      \n");
  }
LAB_00103510:
  free(local_20);
  tjFree(local_28);
  if (local_30 != 0) {
    tjDestroy(local_30);
  }
  return;
}

Assistant:

static void bufSizeTest(void)
{
  int w, h, i, subsamp;
  unsigned char *srcBuf = NULL, *dstBuf = NULL;
  tjhandle handle = NULL;
  unsigned long dstSize = 0;

  if ((handle = tjInitCompress()) == NULL) THROW_TJ();

  printf("Buffer size regression test\n");
  for (subsamp = 0; subsamp < TJ_NUMSAMP; subsamp++) {
    for (w = 1; w < 48; w++) {
      int maxh = (w == 1) ? 2048 : 48;

      for (h = 1; h < maxh; h++) {
        if (h % 100 == 0) printf("%.4d x %.4d\b\b\b\b\b\b\b\b\b\b\b", w, h);
        if ((srcBuf = (unsigned char *)malloc(w * h * 4)) == NULL)
          THROW("Memory allocation failure");
        if (!alloc || doYUV) {
          if (doYUV) dstSize = tjBufSizeYUV2(w, pad, h, subsamp);
          else dstSize = tjBufSize(w, h, subsamp);
          if ((dstBuf = (unsigned char *)tjAlloc(dstSize)) == NULL)
            THROW("Memory allocation failure");
        }

        for (i = 0; i < w * h * 4; i++) {
          if (random() < RAND_MAX / 2) srcBuf[i] = 0;
          else srcBuf[i] = 255;
        }

        if (doYUV) {
          TRY_TJ(tjEncodeYUV3(handle, srcBuf, w, 0, h, TJPF_BGRX, dstBuf, pad,
                              subsamp, 0));
        } else {
          TRY_TJ(tjCompress2(handle, srcBuf, w, 0, h, TJPF_BGRX, &dstBuf,
                             &dstSize, subsamp, 100,
                             alloc ? 0 : TJFLAG_NOREALLOC));
        }
        free(srcBuf);  srcBuf = NULL;
        if (!alloc || doYUV) {
          tjFree(dstBuf);  dstBuf = NULL;
        }

        if ((srcBuf = (unsigned char *)malloc(h * w * 4)) == NULL)
          THROW("Memory allocation failure");
        if (!alloc || doYUV) {
          if (doYUV) dstSize = tjBufSizeYUV2(h, pad, w, subsamp);
          else dstSize = tjBufSize(h, w, subsamp);
          if ((dstBuf = (unsigned char *)tjAlloc(dstSize)) == NULL)
            THROW("Memory allocation failure");
        }

        for (i = 0; i < h * w * 4; i++) {
          if (random() < RAND_MAX / 2) srcBuf[i] = 0;
          else srcBuf[i] = 255;
        }

        if (doYUV) {
          TRY_TJ(tjEncodeYUV3(handle, srcBuf, h, 0, w, TJPF_BGRX, dstBuf, pad,
                              subsamp, 0));
        } else {
          TRY_TJ(tjCompress2(handle, srcBuf, h, 0, w, TJPF_BGRX, &dstBuf,
                             &dstSize, subsamp, 100,
                             alloc ? 0 : TJFLAG_NOREALLOC));
        }
        free(srcBuf);  srcBuf = NULL;
        if (!alloc || doYUV) {
          tjFree(dstBuf);  dstBuf = NULL;
        }
      }
    }
  }
  printf("Done.      \n");

bailout:
  free(srcBuf);
  tjFree(dstBuf);
  if (handle) tjDestroy(handle);
}